

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

Abc_Ntk_t * Abc_SclPerformBuffering(Abc_Ntk_t *p,int DegreeR,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *p_00;
  int local_3c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNew;
  Vec_Int_t *vCiLevs;
  int fVerbose_local;
  int fUseInvs_local;
  int Degree_local;
  int DegreeR_local;
  Abc_Ntk_t *p_local;
  
  iVar1 = Abc_NtkHasMapping(p);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBuffer.c"
                  ,0x1d1,"Abc_Ntk_t *Abc_SclPerformBuffering(Abc_Ntk_t *, int, int, int, int)");
  }
  if ((fUseInvs != 0) &&
     (printf("Warning!!! Using inverters instead of buffers.\n"), p->vPhases == (Vec_Int_t *)0x0)) {
    printf("The phases are not given. The result will not verify.\n");
  }
  iVar1 = Abc_NtkCiNum(p);
  pVVar2 = Vec_IntAlloc(iVar1);
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCi(p,local_3c);
    iVar1 = Abc_ObjLevel(pAVar3);
    Vec_IntPush(pVVar2,iVar1);
  }
  Abc_NtkIncrementTravId(p);
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCi(p,local_3c);
    Abc_SclPerformBuffering_rec(pAVar3,DegreeR,Degree,fUseInvs,fVerbose);
  }
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(p), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCi(p,local_3c);
    iVar1 = Vec_IntEntry(pVVar2,local_3c);
    *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 & 0xfff | iVar1 << 0xc;
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkObj(p,local_3c);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
      Abc_ObjLevelNew(pAVar3);
    }
  }
  Vec_IntFree(pVVar2);
  if (p->vPhases != (Vec_Int_t *)0x0) {
    pVVar2 = p->vPhases;
    iVar1 = Abc_NtkObjNumMax(p);
    Vec_IntFillExtra(pVVar2,iVar1,0);
  }
  p_00 = Abc_NtkDupDfs(p);
  Abc_SclCheckNtk(p_00,fVerbose);
  return p_00;
}

Assistant:

Abc_Ntk_t * Abc_SclPerformBuffering( Abc_Ntk_t * p, int DegreeR, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Int_t * vCiLevs;
    Abc_Ntk_t * pNew;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasMapping(p) );
    if ( fUseInvs )
    {
        printf( "Warning!!! Using inverters instead of buffers.\n" );
        if ( p->vPhases == NULL )
            printf( "The phases are not given. The result will not verify.\n" );
    }
    // remember CI levels
    vCiLevs = Vec_IntAlloc( Abc_NtkCiNum(p) );
    Abc_NtkForEachCi( p, pObj, i )
        Vec_IntPush( vCiLevs, Abc_ObjLevel(pObj) );
    // perform buffering
    Abc_NtkIncrementTravId( p );        
    Abc_NtkForEachCi( p, pObj, i )
        Abc_SclPerformBuffering_rec( pObj, DegreeR, Degree, fUseInvs, fVerbose );
    // recompute logic levels
    Abc_NtkForEachCi( p, pObj, i )
        pObj->Level = Vec_IntEntry( vCiLevs, i );
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjLevelNew( pObj );
    Vec_IntFree( vCiLevs );
    // if phases are present
    if ( p->vPhases )
        Vec_IntFillExtra( p->vPhases, Abc_NtkObjNumMax(p), 0 );
    // duplication in topo order
    pNew = Abc_NtkDupDfs( p );
    Abc_SclCheckNtk( pNew, fVerbose );
//    Abc_NtkDelete( pNew );
    return pNew;
}